

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.h
# Opt level: O3

vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
* __thiscall
phmap::priv::GenerateValuesWithSeed<std::pair<std::pair<int,int>,std::pair<int,int>>>
          (vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
           *__return_storage_ptr__,priv *this,size_t n,int maxval,int seed)

{
  pointer *pppVar1;
  iterator __position;
  pair<int,_int> pVar2;
  int iVar3;
  priv *ppVar4;
  vector<int,_std::allocator<int>_> nums;
  pair<std::pair<int,_int>,_std::pair<int,_int>_> local_70;
  vector<int,_std::allocator<int>_> local_60;
  Generator<std::pair<int,_int>_> local_48;
  Generator<std::pair<int,_int>_> aGStack_40 [2];
  
  iVar3 = (int)n;
  GenerateNumbersWithSeed(&local_60,(size_t)this,iVar3,maxval);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.tgen.maxval = iVar3;
  local_48.ugen.maxval = iVar3;
  aGStack_40[0].tgen.maxval = iVar3;
  aGStack_40[0].ugen.maxval = iVar3;
  std::
  vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::reserve(__return_storage_ptr__,(size_type)this);
  if (this != (priv *)0x0) {
    ppVar4 = (priv *)0x0;
    do {
      iVar3 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[(long)ppVar4];
      pVar2 = Generator<std::pair<int,_int>_>::operator()(&local_48,iVar3);
      local_70.second = Generator<std::pair<int,_int>_>::operator()(aGStack_40,iVar3);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_70.first = pVar2;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
        ::_M_realloc_insert<std::pair<std::pair<int,int>,std::pair<int,int>>>
                  ((vector<std::pair<std::pair<int,int>,std::pair<int,int>>,std::allocator<std::pair<std::pair<int,int>,std::pair<int,int>>>>
                    *)__return_storage_ptr__,__position,&local_70);
      }
      else {
        (__position._M_current)->first = pVar2;
        (__position._M_current)->second = local_70.second;
        pppVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      ppVar4 = ppVar4 + 1;
    } while (this != ppVar4);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<V> GenerateValuesWithSeed(size_t n, int maxval, int seed) {
        const std::vector<int> nums = GenerateNumbersWithSeed(n, maxval, seed);
        Generator<V> gen(maxval);
        std::vector<V> vec;

        vec.reserve(n);
        for (size_t i = 0; i < n; i++) {
            vec.push_back(gen(nums[i]));
        }

        return vec;
    }